

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O3

StringList * __thiscall
Args::HelpPrinter::createUsageString
          (StringList *__return_storage_ptr__,HelpPrinter *this,ArgIface *arg,bool required)

{
  QArrayData *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined3 in_register_00000009;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  String usage;
  QArrayData *local_58 [4];
  QString local_38;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (String *)0x0;
  local_38.d.size = 0;
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  if (CONCAT31(in_register_00000009,required) == 0) {
    QVar3.m_data = (storage_type *)0x2;
    QVar3.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar3);
    pQVar1 = local_58[0];
    QString::append(&local_38);
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
  }
  iVar2 = (*arg->_vptr_ArgIface[7])(arg);
  if (*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) != 0) {
    QVar4.m_data = (storage_type *)0x1;
    QVar4.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar4);
    pQVar1 = local_58[0];
    QString::append(&local_38);
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    (*arg->_vptr_ArgIface[7])(arg);
    QString::append(&local_38);
    iVar2 = (*arg->_vptr_ArgIface[8])(arg);
    if (*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x10) != 0) {
      QVar5.m_data = (storage_type *)0x1;
      QVar5.m_size = (qsizetype)local_58;
      QString::fromUtf8(QVar5);
      pQVar1 = local_58[0];
      QString::append(&local_38);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
      QtPrivate::QGenericArrayOps<Args::String>::emplace<Args::String_const&>
                ((QGenericArrayOps<Args::String> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(String *)&local_38);
      String::clear((String *)&local_38);
    }
  }
  iVar2 = (*arg->_vptr_ArgIface[8])(arg);
  if (*(long *)(CONCAT44(extraout_var_01,iVar2) + 0x10) == 0) {
    iVar2 = (*arg->_vptr_ArgIface[7])(arg);
    if (*(long *)(CONCAT44(extraout_var_02,iVar2) + 0x10) == 0) {
      iVar2 = (*arg->_vptr_ArgIface[8])(arg);
      if (*(long *)(CONCAT44(extraout_var_03,iVar2) + 0x10) == 0) {
        (*arg->_vptr_ArgIface[3])(local_58,arg);
        QString::append(&local_38);
        if (local_58[0] != (QArrayData *)0x0) {
          LOCK();
          (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_58[0],2,8);
          }
        }
      }
    }
  }
  else {
    QVar6.m_data = (storage_type *)0x2;
    QVar6.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar6);
    pQVar1 = local_58[0];
    QString::append(&local_38);
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    (*arg->_vptr_ArgIface[8])(arg);
    QString::append(&local_38);
  }
  iVar2 = (*arg->_vptr_ArgIface[4])(arg);
  if ((char)iVar2 != '\0') {
    QVar7.m_data = (storage_type *)0x2;
    QVar7.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar7);
    pQVar1 = local_58[0];
    QString::append(&local_38);
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    (*arg->_vptr_ArgIface[9])(arg);
    QString::append(&local_38);
    QVar8.m_data = (storage_type *)0x1;
    QVar8.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar8);
    pQVar1 = local_58[0];
    QString::append(&local_38);
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
  }
  if (!required) {
    QVar9.m_data = (storage_type *)0x2;
    QVar9.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar9);
    QString::append(&local_38);
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,8);
      }
    }
  }
  QtPrivate::QGenericArrayOps<Args::String>::emplace<Args::String_const&>
            ((QGenericArrayOps<Args::String> *)__return_storage_ptr__,
             (__return_storage_ptr__->d).size,(String *)&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline StringList
HelpPrinter::createUsageString( ArgIface * arg, bool required ) const
{
	StringList result;

	String usage;

	if( !required )
		usage.append( SL( "[ " ) );

	if( !arg->flag().empty() )
	{
		usage.append( SL( "-" ) );
		usage.append( arg->flag() );

		if( !arg->argumentName().empty() )
		{
			usage.append( SL( "," ) );

			result.push_back( usage );

			usage.clear();
		}
	}

	if( !arg->argumentName().empty() )
	{
		usage.append( SL( "--" ) );
		usage.append( arg->argumentName() );
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
		usage.append( arg->name() );

	if( arg->isWithValue() )
	{
		usage.append( SL( " <" ) );
		usage.append( arg->valueSpecifier() );
		usage.append( SL( ">" ) );
	}

	if( !required )
		usage.append( SL( " ]" ) );

	result.push_back( usage );

	return result;
}